

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Client::Client(Client *this,char *host,int port,time_t timeout_sec)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_29;
  time_t local_28;
  time_t timeout_sec_local;
  char *pcStack_18;
  int port_local;
  char *host_local;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_00260450;
  local_28 = timeout_sec;
  timeout_sec_local._4_4_ = port;
  pcStack_18 = host;
  host_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->host_,host,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  this->port_ = timeout_sec_local._4_4_;
  this->timeout_sec_ = local_28;
  std::operator+(&local_60,&this->host_,":");
  std::__cxx11::to_string(&local_80,this->port_);
  std::operator+(&this->host_and_port_,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

inline Client::Client(
    const char* host, int port, time_t timeout_sec)
    : host_(host)
    , port_(port)
    , timeout_sec_(timeout_sec)
    , host_and_port_(host_ + ":" + std::to_string(port_))
{
}